

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam000000000019d0a0 = 0x2d2d2d2d2d2d2d;
    uRam000000000019d0a7._0_1_ = '-';
    uRam000000000019d0a7._1_1_ = '-';
    uRam000000000019d0a7._2_1_ = '-';
    uRam000000000019d0a7._3_1_ = '-';
    uRam000000000019d0a7._4_1_ = '-';
    uRam000000000019d0a7._5_1_ = '-';
    uRam000000000019d0a7._6_1_ = '-';
    uRam000000000019d0a7._7_1_ = '-';
    DAT_0019d090 = '-';
    DAT_0019d090_1._0_1_ = '-';
    DAT_0019d090_1._1_1_ = '-';
    DAT_0019d090_1._2_1_ = '-';
    DAT_0019d090_1._3_1_ = '-';
    DAT_0019d090_1._4_1_ = '-';
    DAT_0019d090_1._5_1_ = '-';
    DAT_0019d090_1._6_1_ = '-';
    uRam000000000019d098 = 0x2d2d2d2d2d2d2d;
    DAT_0019d09f = 0x2d;
    DAT_0019d080 = '-';
    DAT_0019d080_1._0_1_ = '-';
    DAT_0019d080_1._1_1_ = '-';
    DAT_0019d080_1._2_1_ = '-';
    DAT_0019d080_1._3_1_ = '-';
    DAT_0019d080_1._4_1_ = '-';
    DAT_0019d080_1._5_1_ = '-';
    DAT_0019d080_1._6_1_ = '-';
    uRam000000000019d088._0_1_ = '-';
    uRam000000000019d088._1_1_ = '-';
    uRam000000000019d088._2_1_ = '-';
    uRam000000000019d088._3_1_ = '-';
    uRam000000000019d088._4_1_ = '-';
    uRam000000000019d088._5_1_ = '-';
    uRam000000000019d088._6_1_ = '-';
    uRam000000000019d088._7_1_ = '-';
    DAT_0019d070 = '-';
    DAT_0019d070_1._0_1_ = '-';
    DAT_0019d070_1._1_1_ = '-';
    DAT_0019d070_1._2_1_ = '-';
    DAT_0019d070_1._3_1_ = '-';
    DAT_0019d070_1._4_1_ = '-';
    DAT_0019d070_1._5_1_ = '-';
    DAT_0019d070_1._6_1_ = '-';
    uRam000000000019d078._0_1_ = '-';
    uRam000000000019d078._1_1_ = '-';
    uRam000000000019d078._2_1_ = '-';
    uRam000000000019d078._3_1_ = '-';
    uRam000000000019d078._4_1_ = '-';
    uRam000000000019d078._5_1_ = '-';
    uRam000000000019d078._6_1_ = '-';
    uRam000000000019d078._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam000000000019d068._0_1_ = '-';
    uRam000000000019d068._1_1_ = '-';
    uRam000000000019d068._2_1_ = '-';
    uRam000000000019d068._3_1_ = '-';
    uRam000000000019d068._4_1_ = '-';
    uRam000000000019d068._5_1_ = '-';
    uRam000000000019d068._6_1_ = '-';
    uRam000000000019d068._7_1_ = '-';
    DAT_0019d0af = 0;
  }
  poVar1 = std::operator<<((ostream *)
                           (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void ConsoleReporter::printSummaryDivider() {
    stream << getLineOfChars<'-'>() << '\n';
}